

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O3

int cfg_db_remove_namedsection(cfg_db *db,char *section_type,char *section_name)

{
  long lVar1;
  cfg_named_section *named;
  int iVar2;
  
  lVar1 = avl_find();
  iVar2 = -1;
  if (lVar1 != 0) {
    named = (cfg_named_section *)avl_find(lVar1 + 0x48,section_name);
    if (named != (cfg_named_section *)0x0) {
      _free_namedsection(named);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
cfg_db_remove_namedsection(struct cfg_db *db, const char *section_type, const char *section_name) {
  struct cfg_named_section *named;

  named = cfg_db_find_namedsection(db, section_type, section_name);
  if (named == NULL) {
    return -1;
  }

  /* only free named section */
  _free_namedsection(named);
  return 0;
}